

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

void __thiscall
pbrt::UniformGridMediumProvider::UniformGridMediumProvider
          (UniformGridMediumProvider *this,Bounds3f *bounds,
          optional<pbrt::SampledGrid<float>_> *dgrid,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *rgbgrid,
          RGBColorSpace *colorSpace,SpectrumHandle *Le,SampledGrid<float> Legrid,Allocator alloc)

{
  undefined8 uVar1;
  float fVar2;
  SampledGrid<pbrt::RGBUnboundedSpectrum> *pSVar3;
  long in_FS_OFFSET;
  long lStack_40;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  
  fVar2 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar2;
  fVar2 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar2;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  pstd::optional<pbrt::SampledGrid<float>_>::optional(&this->densityGrid,dgrid);
  pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional
            (&this->rgbDensityGrid,rgbgrid);
  this->colorSpace = colorSpace;
  local_38.bits =
       (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Le_spec,(SpectrumHandle *)&local_38,(Allocator)Legrid.values.ptr);
  SampledGrid<float>::SampledGrid
            (&this->LeScaleGrid,(SampledGrid<float> *)Legrid.values.alloc.memoryResource);
  *(long *)(in_FS_OFFSET + -0x410) =
       *(long *)(in_FS_OFFSET + -0x410) + (this->LeScaleGrid).values.nStored * 4;
  if ((this->densityGrid).set == true) {
    pSVar3 = (SampledGrid<pbrt::RGBUnboundedSpectrum> *)
             pstd::optional<pbrt::SampledGrid<float>_>::value(&this->densityGrid);
    lStack_40 = 2;
  }
  else {
    pSVar3 = pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::value
                       (&this->rgbDensityGrid);
    lStack_40 = 4;
  }
  *(long *)(in_FS_OFFSET + -0x410) =
       *(long *)(in_FS_OFFSET + -0x410) + ((pSVar3->values).nStored << lStack_40);
  return;
}

Assistant:

UniformGridMediumProvider::UniformGridMediumProvider(
    const Bounds3f &bounds, pstd::optional<SampledGrid<Float>> dgrid,
    pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbgrid,
    const RGBColorSpace *colorSpace, SpectrumHandle Le, SampledGrid<Float> Legrid,
    Allocator alloc)
    : bounds(bounds),
      densityGrid(std::move(dgrid)),
      rgbDensityGrid(std::move(rgbgrid)),
      colorSpace(colorSpace),
      Le_spec(Le, alloc),
      LeScaleGrid(std::move(Legrid)) {
    volumeGridBytes += LeScaleGrid.BytesAllocated();
    volumeGridBytes +=
        densityGrid ? densityGrid->BytesAllocated() : rgbDensityGrid->BytesAllocated();
}